

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall
kratos::DebugDatabase::set_break_points(DebugDatabase *this,Generator *top,string *ext)

{
  _Vector_base<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *this_01;
  long *plVar1;
  pointer ppVar2;
  __type_conflict2 _Var3;
  long *plVar4;
  undefined1 filename [8];
  undefined1 local_b8 [8];
  string fn_ext;
  undefined1 local_70 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  fn_ln;
  Stmt *stmt;
  
  this_00 = (_Vector_base<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *)
            ((long)&fn_ext.field_2 + 8);
  extract_debug_break_points
            ((vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *)this_00,top);
  std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>::_M_move_assign
            ((vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *)this,this_00);
  std::_Vector_base<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>::~_Vector_base
            (this_00);
  plVar4 = *(long **)this;
  plVar1 = *(long **)(this + 8);
  do {
    if (plVar4 == plVar1) {
      compute_generators(this,top);
      return;
    }
    fn_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar4;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)local_70,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&((fn_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->first)._M_string_length);
    ppVar2 = fn_ln.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (filename = local_70; filename != (undefined1  [8])ppVar2;
        filename = (undefined1  [8])((long)filename + 0x28)) {
      fs::get_ext((string *)local_b8,(string *)filename);
      _Var3 = std::operator==((string *)local_b8,ext);
      if (_Var3) {
        this_01 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                   *)(fn_ext.field_2._M_local_buf + 8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_true>
                  (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           filename,&((pointer)filename)->second);
        std::
        _Rb_tree<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>,std::_Select1st<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::less<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>>
        ::_M_emplace_unique<kratos::Stmt_const*&,std::pair<std::__cxx11::string,unsigned_int>>
                  ((_Rb_tree<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>,std::_Select1st<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::less<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>>
                    *)(this + 0x18),
                   (Stmt **)&fn_ln.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,this_01);
        std::__cxx11::string::~string((string *)this_01);
        std::__cxx11::string::~string((string *)local_b8);
        break;
      }
      std::__cxx11::string::~string((string *)local_b8);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)local_70);
    plVar4 = plVar4 + 1;
  } while( true );
}

Assistant:

void DebugDatabase::set_break_points(Generator *top, const std::string &ext) {
    // set the break points
    break_points_ = extract_debug_break_points(top);

    // index all the front-end code
    // we are only interested in the files that has the extension
    for (auto const *stmt : break_points_) {
        auto fn_ln = stmt->fn_name_ln;
        for (auto const &[fn, ln] : fn_ln) {
            auto fn_ext = fs::get_ext(fn);
            if (fn_ext == ext) {
                // this is the one we need
                stmt_mapping_.emplace(stmt, std::make_pair(fn, ln));
                break;
            }
        }
    }
    // set generators
    compute_generators(top);
}